

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_negation_range_inplace
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  bool bVar1;
  int iVar2;
  array_container_t *paVar3;
  container_t **dst_local;
  int range_end_local;
  int range_start_local;
  bitset_container_t *src_local;
  
  bitset_flip_range(src->words,range_start,range_end);
  iVar2 = bitset_container_compute_cardinality(src);
  src->cardinality = iVar2;
  bVar1 = src->cardinality < 0x1001;
  if (bVar1) {
    paVar3 = array_container_from_bitset(src);
    *dst = paVar3;
    bitset_container_free(src);
  }
  else {
    *dst = src;
  }
  src_local._7_1_ = !bVar1;
  return src_local._7_1_;
}

Assistant:

bool bitset_container_negation_range_inplace(
    bitset_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    bitset_flip_range(src->words, (uint32_t)range_start, (uint32_t)range_end);
    src->cardinality = bitset_container_compute_cardinality(src);
    if (src->cardinality > DEFAULT_MAX_SIZE) {
        *dst = src;
        return true;
    }
    *dst = array_container_from_bitset(src);
    bitset_container_free(src);
    return false;
}